

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

drwav_bool32
drwav__on_seek(drwav_seek_proc onSeek,void *pUserData,int offset,drwav_seek_origin origin,
              drwav_uint64 *pCursor)

{
  drwav_bool32 dVar1;
  drwav_uint64 dVar2;
  
  if (onSeek == (drwav_seek_proc)0x0) {
    __assert_fail("onSeek != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/khang06[P]dsiflipencode/include/dr_wav.h"
                  ,0x60c,
                  "drwav_bool32 drwav__on_seek(drwav_seek_proc, void *, int, drwav_seek_origin, drwav_uint64 *)"
                 );
  }
  if (pCursor != (drwav_uint64 *)0x0) {
    dVar1 = (*onSeek)(pUserData,offset,origin);
    if (dVar1 == 0) {
      dVar1 = 0;
    }
    else {
      dVar2 = (drwav_uint64)offset;
      if (origin != drwav_seek_origin_start) {
        dVar2 = dVar2 + *pCursor;
      }
      *pCursor = dVar2;
      dVar1 = 1;
    }
    return dVar1;
  }
  __assert_fail("pCursor != __null",
                "/workspace/llm4binary/github/license_c_cmakelists/khang06[P]dsiflipencode/include/dr_wav.h"
                ,0x60d,
                "drwav_bool32 drwav__on_seek(drwav_seek_proc, void *, int, drwav_seek_origin, drwav_uint64 *)"
               );
}

Assistant:

drwav_bool32 drwav__on_seek(drwav_seek_proc onSeek, void* pUserData, int offset, drwav_seek_origin origin, drwav_uint64* pCursor)
{
    drwav_assert(onSeek != NULL);
    drwav_assert(pCursor != NULL);

    if (!onSeek(pUserData, offset, origin)) {
        return DRWAV_FALSE;
    }

    if (origin == drwav_seek_origin_start) {
        *pCursor = offset;
    } else {
        *pCursor += offset;
    }

    return DRWAV_TRUE;
}